

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstSampler.h
# Opt level: O0

void __thiscall jaegertracing::samplers::ConstSampler::ConstSampler(ConstSampler *this,bool sample)

{
  initializer_list<jaegertracing::Tag> __l;
  Tag *local_158;
  allocator<jaegertracing::Tag> local_11b;
  undefined1 local_11a;
  allocator local_119;
  string local_118;
  allocator local_e1;
  string local_e0;
  Tag *local_c0;
  Tag local_b8;
  Tag local_70;
  iterator local_28;
  size_type local_20;
  undefined1 local_11;
  undefined8 uStack_10;
  bool sample_local;
  ConstSampler *this_local;
  
  local_11 = sample;
  uStack_10 = this;
  Sampler::Sampler(&this->super_Sampler);
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__ConstSampler_003b2ac8;
  this->_decision = (bool)(local_11 & 1);
  local_11a = 1;
  local_c0 = &local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"sampler.type",&local_e1);
  Tag::Tag<char_const*const&>(&local_b8,&local_e0,(char **)&kSamplerTypeConst);
  local_c0 = &local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"sampler.param",&local_119);
  Tag::Tag<bool&>(&local_70,&local_118,&this->_decision);
  local_11a = 0;
  local_28 = &local_b8;
  local_20 = 2;
  std::allocator<jaegertracing::Tag>::allocator(&local_11b);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_11b);
  std::allocator<jaegertracing::Tag>::~allocator(&local_11b);
  local_158 = (Tag *)&local_28;
  do {
    local_158 = local_158 + -1;
    Tag::~Tag(local_158);
  } while (local_158 != &local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

explicit ConstSampler(bool sample)
        : _decision(sample)
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeConst },
                  { kSamplerParamTagKey, _decision } })
    {
    }